

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdn_test.cc
# Opt level: O3

int main(void)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pCVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined3 uVar5;
  undefined1 uVar6;
  undefined4 uVar7;
  CdnAddCdnDomainRequestType *this;
  HttpTestListener *pHVar8;
  undefined8 extraout_RAX;
  CdnAddCdnDomainResponseType resp;
  CdnAddCdnDomainRequestType req;
  CdnDescribeCdnDomainBaseDetailRequestType req_2;
  undefined7 *local_298;
  undefined8 local_290;
  undefined7 local_288;
  undefined1 uStack_281;
  undefined1 uStack_280;
  undefined2 uStack_27f;
  undefined1 local_27d;
  long *local_278;
  undefined8 local_270;
  long local_268;
  ushort local_260;
  string local_258;
  string local_238;
  string local_218;
  undefined1 local_1f8 [32];
  _Alloc_hider local_1d8;
  undefined1 local_1d0 [24];
  _Alloc_hider local_1b8;
  undefined1 local_1b0 [24];
  _Alloc_hider local_198;
  undefined1 local_190 [24];
  _Alloc_hider local_178;
  undefined1 local_170 [24];
  _Alloc_hider local_158;
  undefined1 local_150 [24];
  _Alloc_hider local_138;
  undefined1 local_130 [24];
  _Alloc_hider local_118;
  undefined1 local_110 [24];
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  _Alloc_hider local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  undefined1 local_b8 [17];
  undefined6 uStack_a7;
  undefined1 uStack_a1;
  undefined3 uStack_a0;
  undefined1 uStack_9d;
  undefined4 uStack_9c;
  char *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  char *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50 [2];
  
  pcVar1 = local_1f8 + 0x10;
  local_1f8._8_8_ = (pointer)0x0;
  local_1f8._16_8_ = local_1f8._16_8_ & 0xffffffffffffff00;
  pcVar2 = local_1d0 + 8;
  local_1d0._0_8_ = 0;
  local_1d0[8] = '\0';
  local_1b8._M_p = local_1b0 + 8;
  local_1b0._0_8_ = 0;
  local_1b0[8] = '\0';
  local_198._M_p = local_190 + 8;
  local_190._0_8_ = 0;
  local_190[8] = '\0';
  local_178._M_p = local_170 + 8;
  local_170._0_8_ = 0;
  local_170[8] = '\0';
  local_158._M_p = local_150 + 8;
  local_150._0_8_ = 0;
  local_150[8] = '\0';
  local_138._M_p = local_130 + 8;
  local_130._0_8_ = 0;
  local_130[8] = '\0';
  local_118._M_p = local_110 + 8;
  local_110._0_8_ = 0;
  local_110[8] = '\0';
  pCVar3 = (pointer)(local_b8 + 0x10);
  local_b8[0x10] = 99;
  uStack_a7 = 0x676e61682d6e;
  uStack_a1 = 0x7a;
  uStack_a0 = 0x756f68;
  local_b8._8_8_ = (pointer)0xb;
  uStack_9d = 0;
  local_288 = 0x697070615f796d;
  uStack_281 = 100;
  local_290 = 8;
  uStack_280 = 0;
  local_268 = 0x65726365735f796d;
  local_260 = 0x74;
  local_270 = 9;
  local_298 = &local_288;
  local_278 = &local_268;
  local_1f8._0_8_ = pcVar1;
  local_1d8._M_p = pcVar2;
  local_b8._0_8_ = pCVar3;
  this = (CdnAddCdnDomainRequestType *)aliyun::Cdn::CreateCdnClient(local_b8,&local_298,&local_278);
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  if (local_298 != &local_288) {
    operator_delete(local_298,CONCAT17(uStack_281,local_288) + 1);
  }
  if ((pointer)local_b8._0_8_ != pCVar3) {
    operator_delete((void *)local_b8._0_8_,
                    CONCAT17(uStack_a1,CONCAT61(uStack_a7,local_b8[0x10])) + 1);
  }
  if (this == (CdnAddCdnDomainRequestType *)0x0) {
    aliyun::CdnAddCdnDomainRequestType::~CdnAddCdnDomainRequestType
              ((CdnAddCdnDomainRequestType *)local_1f8);
    local_1f8._8_8_ = (pointer)0x0;
    local_1f8._16_8_ = local_1f8._16_8_ & 0xffffffffffffff00;
    local_1d0._0_8_ = 0;
    local_1d0[8] = '\0';
    local_1b8._M_p = local_1b0 + 8;
    local_1b0._0_8_ = 0;
    local_1b0[8] = '\0';
    local_198._M_p = local_190 + 8;
    local_190._0_8_ = 0;
    local_190[8] = '\0';
    local_b8[0x10] = 99;
    uStack_a7 = 0x676e61682d6e;
    uStack_a1 = 0x7a;
    uStack_a0 = 0x756f68;
    local_b8._8_8_ = (pointer)0xb;
    uStack_9d = 0;
    local_288 = 0x697070615f796d;
    uStack_281 = 100;
    local_290 = 8;
    uStack_280 = 0;
    local_268 = 0x65726365735f796d;
    local_270 = 9;
    local_260 = 0x74;
    local_298 = &local_288;
    local_278 = &local_268;
    local_1f8._0_8_ = pcVar1;
    local_1d8._M_p = pcVar2;
    local_b8._0_8_ = pCVar3;
    this = (CdnAddCdnDomainRequestType *)aliyun::Cdn::CreateCdnClient();
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,CONCAT17(uStack_281,local_288) + 1);
    }
    if ((pointer)local_b8._0_8_ != pCVar3) {
      operator_delete((void *)local_b8._0_8_,
                      CONCAT17(uStack_a1,CONCAT61(uStack_a7,local_b8[0x10])) + 1);
    }
    if (this != (CdnAddCdnDomainRequestType *)0x0) goto LAB_00107b76;
    if (local_198._M_p != local_190 + 8) {
      operator_delete(local_198._M_p,CONCAT71(local_190._9_7_,local_190[8]) + 1);
    }
    if (local_1b8._M_p != local_1b0 + 8) {
      operator_delete(local_1b8._M_p,CONCAT71(local_1b0._9_7_,local_1b0[8]) + 1);
    }
    if (local_1d8._M_p != pcVar2) {
      operator_delete(local_1d8._M_p,CONCAT71(local_1d0._9_7_,local_1d0[8]) + 1);
    }
    if ((pointer)local_1f8._0_8_ != pcVar1) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    local_98 = local_90._M_local_buf + 8;
    local_b8._8_8_ = (pointer)0x0;
    local_b8[0x10] = 0;
    local_90._0_8_ = 0;
    local_90._M_local_buf[8] = '\0';
    local_78 = local_70._M_local_buf + 8;
    local_70._0_8_ = 0;
    local_70._M_local_buf[8] = '\0';
    local_58 = local_50[0]._M_local_buf + 8;
    local_50[0]._0_8_ = 0;
    local_50[0]._M_local_buf[8] = '\0';
    local_1f8._24_8_ = local_1d0;
    local_1f8._16_8_ = 0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    local_1d8._M_p = (pointer)0x0;
    local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
    local_1d0._16_8_ = local_1b0;
    local_1b8._M_p = (pointer)0x0;
    local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
    local_1b0._16_8_ = local_190;
    local_198._M_p = (pointer)0x0;
    local_190._0_8_ = local_190._0_8_ & 0xffffffffffffff00;
    local_190._16_8_ = local_170;
    local_178._M_p = (pointer)0x0;
    local_170._0_8_ = local_170._0_8_ & 0xffffffffffffff00;
    local_158._M_p = (pointer)0x0;
    local_150._0_8_ = local_150._0_8_ & 0xffffffffffffff00;
    local_138._M_p = (pointer)0x0;
    local_130._0_8_ = local_130._0_8_ & 0xffffffffffffff00;
    local_118._M_p = (pointer)0x0;
    local_110._0_8_ = local_110._0_8_ & 0xffffffffffffff00;
    local_f8 = 0;
    local_f0._M_local_buf[0] = '\0';
    local_298 = &local_288;
    local_288 = 0x676e61682d6e63;
    uStack_281 = 0x7a;
    uStack_280 = 0x68;
    uStack_27f = 0x756f;
    local_290 = 0xb;
    local_27d = 0;
    local_278 = &local_268;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = local_260 & 0xff00;
    local_258.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_258.field_2._M_local_buf[7] = 'e';
    local_258.field_2._M_local_buf[8] = 't';
    local_258.field_2._M_local_buf[9] = '\0';
    local_258._M_string_length = 9;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    local_170._16_8_ = local_150;
    local_150._16_8_ = local_130;
    local_130._16_8_ = local_110;
    local_110._16_8_ = &local_f0;
    local_b8._0_8_ = pCVar3;
    this = (CdnAddCdnDomainRequestType *)
           aliyun::Cdn::CreateCdnClient(&local_298,&local_278,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               local_258.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,CONCAT17(uStack_281,local_288) + 1);
    }
    if (this != (CdnAddCdnDomainRequestType *)0x0) goto LAB_00107cbe;
    aliyun::CdnDescribeCdnDomainBaseDetailDomainBaseDetailModelType::
    ~CdnDescribeCdnDomainBaseDetailDomainBaseDetailModelType
              ((CdnDescribeCdnDomainBaseDetailDomainBaseDetailModelType *)local_1f8);
    if (local_58 != local_50[0]._M_local_buf + 8) {
      operator_delete(local_58,CONCAT71(local_50[0]._9_7_,local_50[0]._M_local_buf[8]) + 1);
    }
    if (local_78 != local_70._M_local_buf + 8) {
      operator_delete(local_78,CONCAT71(local_70._9_7_,local_70._M_local_buf[8]) + 1);
    }
    if (local_98 != local_90._M_local_buf + 8) {
      operator_delete(local_98,CONCAT71(local_90._9_7_,local_90._M_local_buf[8]) + 1);
    }
    if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,
                      CONCAT17(uStack_a1,CONCAT61(uStack_a7,local_b8[0x10])) + 1);
    }
    local_e0._M_p = (pointer)&local_d0;
    local_1f8._16_8_ = 0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    local_1f8._24_8_ = local_1d0;
    local_1d8._M_p = (pointer)0x0;
    local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
    local_1d0._16_8_ = local_1b0;
    local_1b8._M_p = (pointer)0x0;
    local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
    local_1b0._16_8_ = local_190;
    local_198._M_p = (pointer)0x0;
    local_190._0_8_ = local_190._0_8_ & 0xffffffffffffff00;
    local_190._16_8_ = local_170;
    local_178._M_p = (pointer)0x0;
    local_170._0_8_ = local_170._0_8_ & 0xffffffffffffff00;
    local_158._M_p = (pointer)0x0;
    local_150._0_8_ = local_150._0_8_ & 0xffffffffffffff00;
    local_138._M_p = (pointer)0x0;
    local_130._0_8_ = local_130._0_8_ & 0xffffffffffffff00;
    pCVar3 = (pointer)(local_b8 + 0x10);
    local_b8._8_8_ = (pointer)0x0;
    local_b8[0x10] = 0;
    local_98 = local_90._M_local_buf + 8;
    local_90._0_8_ = 0;
    local_90._M_local_buf[8] = '\0';
    local_78 = local_70._M_local_buf + 8;
    local_70._0_8_ = 0;
    local_70._M_local_buf[8] = '\0';
    local_58 = local_50[0]._M_local_buf + 8;
    local_50[0]._0_8_ = 0;
    local_50[0]._M_local_buf[8] = '\0';
    local_118._M_p = (pointer)0x0;
    local_110._0_8_ = local_110._0_8_ & 0xffffffffffffff00;
    local_f8 = 0;
    local_f0._M_local_buf[0] = '\0';
    local_d8 = 0;
    local_d0._M_local_buf[0] = '\0';
    local_288 = 0x676e61682d6e63;
    uStack_281 = 0x7a;
    uStack_280 = 0x68;
    uStack_27f = 0x756f;
    local_290 = 0xb;
    local_27d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = local_260 & 0xff00;
    local_258.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_258.field_2._M_local_buf[7] = 'e';
    local_258.field_2._M_local_buf[8] = 't';
    local_258.field_2._M_local_buf[9] = '\0';
    local_258._M_string_length = 9;
    local_298 = &local_288;
    local_278 = &local_268;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    local_170._16_8_ = local_150;
    local_150._16_8_ = local_130;
    local_130._16_8_ = local_110;
    local_110._16_8_ = &local_f0;
    local_b8._0_8_ = pCVar3;
    this = (CdnAddCdnDomainRequestType *)aliyun::Cdn::CreateCdnClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               local_258.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,CONCAT17(uStack_281,local_288) + 1);
    }
    if (this != (CdnAddCdnDomainRequestType *)0x0) goto LAB_00107e0b;
    aliyun::CdnDescribeCdnDomainDetailGetDomainDetailModelType::
    ~CdnDescribeCdnDomainDetailGetDomainDetailModelType
              ((CdnDescribeCdnDomainDetailGetDomainDetailModelType *)local_1f8);
    if (local_58 != local_50[0]._M_local_buf + 8) {
      operator_delete(local_58,CONCAT71(local_50[0]._9_7_,local_50[0]._M_local_buf[8]) + 1);
    }
    if (local_78 != local_70._M_local_buf + 8) {
      operator_delete(local_78,CONCAT71(local_70._9_7_,local_70._M_local_buf[8]) + 1);
    }
    if (local_98 != local_90._M_local_buf + 8) {
      operator_delete(local_98,CONCAT71(local_90._9_7_,local_90._M_local_buf[8]) + 1);
    }
    if ((pointer)local_b8._0_8_ != pCVar3) {
      operator_delete((void *)local_b8._0_8_,
                      CONCAT17(uStack_a1,CONCAT61(uStack_a7,local_b8[0x10])) + 1);
    }
    local_1f8._8_8_ = (pointer)0x0;
    local_1f8._16_8_ = local_1f8._16_8_ & 0xffffffffffffff00;
    local_1d8._M_p = local_1d0 + 8;
    local_1d0._0_8_ = 0;
    local_1d0[8] = '\0';
    local_1b8._M_p = local_1b0 + 8;
    local_1b0._0_8_ = 0;
    local_1b0[8] = '\0';
    local_198._M_p = local_190 + 8;
    local_190._0_8_ = 0;
    local_190[8] = '\0';
    local_178._M_p = local_170 + 8;
    local_170._0_8_ = 0;
    local_170[8] = '\0';
    local_b8[0x10] = 0;
    uStack_a7 = 0;
    local_b8._0_8_ = (pointer)0x0;
    local_b8._8_8_ = (pointer)0x0;
    uStack_a0 = SUB83(&local_90,0);
    uVar5 = uStack_a0;
    uStack_a1 = 0;
    uStack_9d = (undefined1)((ulong)&local_90 >> 0x18);
    uVar6 = uStack_9d;
    uStack_9c = (undefined4)((ulong)&local_90 >> 0x20);
    uVar7 = uStack_9c;
    local_98 = (char *)0x0;
    local_90._0_8_ = local_90._0_8_ & 0xffffffffffffff00;
    local_288 = 0x676e61682d6e63;
    uStack_281 = 0x7a;
    uStack_280 = 0x68;
    uStack_27f = 0x756f;
    local_290 = 0xb;
    local_27d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = local_260 & 0xff00;
    local_258.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_258.field_2._M_local_buf[7] = 'e';
    local_258.field_2._M_local_buf[8] = 't';
    local_258._M_string_length = 9;
    local_258.field_2._M_local_buf[9] = '\0';
    local_298 = &local_288;
    local_278 = &local_268;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    local_1f8._0_8_ = local_1f8 + 0x10;
    this = (CdnAddCdnDomainRequestType *)aliyun::Cdn::CreateCdnClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               local_258.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,CONCAT17(uStack_281,local_288) + 1);
    }
    if (this != (CdnAddCdnDomainRequestType *)0x0) goto LAB_00107f58;
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)CONCAT44(uStack_9c,CONCAT13(uStack_9d,uStack_a0));
    if (paVar4 != &local_90) {
      operator_delete(paVar4,local_90._0_8_ + 1);
    }
    std::
    vector<aliyun::CdnDescribeCdnDomainLogsDomainLogDetailType,_std::allocator<aliyun::CdnDescribeCdnDomainLogsDomainLogDetailType>_>
    ::~vector((vector<aliyun::CdnDescribeCdnDomainLogsDomainLogDetailType,_std::allocator<aliyun::CdnDescribeCdnDomainLogsDomainLogDetailType>_>
               *)local_b8);
    if (local_178._M_p != local_170 + 8) {
      operator_delete(local_178._M_p,CONCAT71(local_170._9_7_,local_170[8]) + 1);
    }
    if (local_198._M_p != local_190 + 8) {
      operator_delete(local_198._M_p,CONCAT71(local_190._9_7_,local_190[8]) + 1);
    }
    if (local_1b8._M_p != local_1b0 + 8) {
      operator_delete(local_1b8._M_p,CONCAT71(local_1b0._9_7_,local_1b0[8]) + 1);
    }
    if (local_1d8._M_p != local_1d0 + 8) {
      operator_delete(local_1d8._M_p,CONCAT71(local_1d0._9_7_,local_1d0[8]) + 1);
    }
    if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    local_1f8._0_8_ = local_1f8 + 0x10;
    local_1f8._8_8_ = (pointer)0x0;
    local_1f8._16_8_ = local_1f8._16_8_ & 0xffffffffffffff00;
    local_1d8._M_p = local_1d0 + 8;
    local_1d0._0_8_ = 0;
    local_1d0[8] = '\0';
    local_1b8._M_p = local_1b0 + 8;
    local_1b0._0_8_ = 0;
    local_1b0[8] = '\0';
    local_198._M_p = local_190 + 8;
    local_190._0_8_ = 0;
    local_190[8] = '\0';
    local_178._M_p = local_170 + 8;
    local_170._0_8_ = 0;
    local_170[8] = '\0';
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_b8[0x10] = 0;
    uStack_a7 = 0;
    uStack_a1 = 0;
    local_b8._0_8_ = (pointer)0x0;
    local_b8._8_8_ = (pointer)0x0;
    local_98 = (char *)0x0;
    local_90._0_8_ = local_90._0_8_ & 0xffffffffffffff00;
    local_78 = local_70._M_local_buf + 8;
    local_70._0_8_ = 0;
    local_70._M_local_buf[8] = '\0';
    local_58 = local_50[0]._M_local_buf + 8;
    local_50[0]._0_8_ = 0;
    local_50[0]._M_local_buf[8] = '\0';
    local_288 = 0x676e61682d6e63;
    uStack_281 = 0x7a;
    uStack_280 = 0x68;
    uStack_27f = 0x756f;
    local_290 = 0xb;
    local_27d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = local_260 & 0xff00;
    local_258.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_258.field_2._M_local_buf[7] = 'e';
    local_258.field_2._M_local_buf[8] = 't';
    local_258._M_string_length = 9;
    local_258.field_2._M_local_buf[9] = '\0';
    local_298 = &local_288;
    local_278 = &local_268;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    uStack_9d = uVar6;
    uStack_9c = uVar7;
    uStack_a0 = uVar5;
    this = (CdnAddCdnDomainRequestType *)aliyun::Cdn::CreateCdnClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               local_258.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,CONCAT17(uStack_281,local_288) + 1);
    }
    if (this != (CdnAddCdnDomainRequestType *)0x0) goto LAB_001080b9;
    if (local_58 != local_50[0]._M_local_buf + 8) {
      operator_delete(local_58,CONCAT71(local_50[0]._9_7_,local_50[0]._M_local_buf[8]) + 1);
    }
    if (local_78 != local_70._M_local_buf + 8) {
      operator_delete(local_78,CONCAT71(local_70._9_7_,local_70._M_local_buf[8]) + 1);
    }
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)CONCAT44(uStack_9c,CONCAT13(uStack_9d,uStack_a0));
    if (paVar4 != &local_90) {
      operator_delete(paVar4,local_90._0_8_ + 1);
    }
    std::
    vector<aliyun::CdnDescribeCdnMonitorDataCDNMonitorDataType,_std::allocator<aliyun::CdnDescribeCdnMonitorDataCDNMonitorDataType>_>
    ::~vector((vector<aliyun::CdnDescribeCdnMonitorDataCDNMonitorDataType,_std::allocator<aliyun::CdnDescribeCdnMonitorDataCDNMonitorDataType>_>
               *)local_b8);
    pcVar1 = local_1f8 + 0x10;
    pcVar2 = local_1d0 + 8;
    if (local_158._M_p != local_150 + 8) {
      operator_delete(local_158._M_p,CONCAT71(local_150._9_7_,local_150[8]) + 1);
    }
    if (local_178._M_p != local_170 + 8) {
      operator_delete(local_178._M_p,CONCAT71(local_170._9_7_,local_170[8]) + 1);
    }
    if (local_198._M_p != local_190 + 8) {
      operator_delete(local_198._M_p,CONCAT71(local_190._9_7_,local_190[8]) + 1);
    }
    if (local_1b8._M_p != local_1b0 + 8) {
      operator_delete(local_1b8._M_p,CONCAT71(local_1b0._9_7_,local_1b0[8]) + 1);
    }
    if (local_1d8._M_p != pcVar2) {
      operator_delete(local_1d8._M_p,CONCAT71(local_1d0._9_7_,local_1d0[8]) + 1);
    }
    if ((pointer)local_1f8._0_8_ != pcVar1) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    local_b8._8_8_ = (pointer)0x0;
    local_b8[0x10] = 0;
    local_98 = local_90._M_local_buf + 8;
    local_90._0_8_ = 0;
    local_90._M_local_buf[8] = '\0';
    local_78 = local_70._M_local_buf + 8;
    local_70._0_8_ = 0;
    local_70._M_local_buf[8] = '\0';
    local_1f8._16_8_ = 0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    local_1f8._24_8_ = local_1d0;
    local_1d8._M_p = (pointer)0x0;
    local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
    local_1d0._16_8_ = local_1b0;
    local_1b8._M_p = (pointer)0x0;
    local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
    local_1b0._16_8_ = local_190;
    local_198._M_p = (pointer)0x0;
    local_190._0_8_ = local_190._0_8_ & 0xffffffffffffff00;
    local_190._16_8_ = local_170;
    local_178._M_p = (pointer)0x0;
    local_170._0_8_ = local_170._0_8_ & 0xffffffffffffff00;
    local_288 = 0x676e61682d6e63;
    uStack_281 = 0x7a;
    uStack_280 = 0x68;
    uStack_27f = 0x756f;
    local_290 = 0xb;
    local_27d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = local_260 & 0xff00;
    local_258.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_258.field_2._M_local_buf[7] = 'e';
    local_258.field_2._M_local_buf[8] = 't';
    local_258._M_string_length = 9;
    local_258.field_2._M_local_buf[9] = '\0';
    local_298 = &local_288;
    local_278 = &local_268;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    local_b8._0_8_ = pCVar3;
    this = (CdnAddCdnDomainRequestType *)aliyun::Cdn::CreateCdnClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               local_258.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,CONCAT17(uStack_281,local_288) + 1);
    }
    if (this != (CdnAddCdnDomainRequestType *)0x0) goto LAB_0010822e;
    if ((undefined1 *)local_190._16_8_ != local_170) {
      operator_delete((void *)local_190._16_8_,local_170._0_8_ + 1);
    }
    if ((undefined1 *)local_1b0._16_8_ != local_190) {
      operator_delete((void *)local_1b0._16_8_,local_190._0_8_ + 1);
    }
    if ((undefined1 *)local_1d0._16_8_ != local_1b0) {
      operator_delete((void *)local_1d0._16_8_,local_1b0._0_8_ + 1);
    }
    if ((undefined1 *)local_1f8._24_8_ != local_1d0) {
      operator_delete((void *)local_1f8._24_8_,local_1d0._0_8_ + 1);
    }
    std::
    vector<aliyun::CdnDescribeCdnServiceLockReasonType,_std::allocator<aliyun::CdnDescribeCdnServiceLockReasonType>_>
    ::~vector((vector<aliyun::CdnDescribeCdnServiceLockReasonType,_std::allocator<aliyun::CdnDescribeCdnServiceLockReasonType>_>
               *)local_1f8);
    if (local_78 != local_70._M_local_buf + 8) {
      operator_delete(local_78,CONCAT71(local_70._9_7_,local_70._M_local_buf[8]) + 1);
    }
    if (local_98 != local_90._M_local_buf + 8) {
      operator_delete(local_98,CONCAT71(local_90._9_7_,local_90._M_local_buf[8]) + 1);
    }
    if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,
                      CONCAT17(uStack_a1,CONCAT61(uStack_a7,local_b8[0x10])) + 1);
    }
    local_1f8._8_8_ = (pointer)0x0;
    local_1f8._16_8_ = local_1f8._16_8_ & 0xffffffffffffff00;
    local_1d0._0_8_ = 0;
    local_1d0[8] = '\0';
    local_1b8._M_p = local_1b0 + 8;
    local_1b0._0_8_ = 0;
    local_1b0[8] = '\0';
    local_198._M_p = local_190 + 8;
    local_190._0_8_ = 0;
    local_190[8] = '\0';
    local_178._M_p = local_170 + 8;
    local_170._0_8_ = 0;
    local_170[8] = '\0';
    local_b8._8_8_ = (pointer)0x0;
    local_b8[0x10] = 0;
    local_98 = local_90._M_local_buf + 8;
    local_90._0_8_ = 0;
    local_90._M_local_buf[8] = '\0';
    local_288 = 0x676e61682d6e63;
    uStack_281 = 0x7a;
    uStack_280 = 0x68;
    uStack_27f = 0x756f;
    local_290 = 0xb;
    local_27d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = local_260 & 0xff00;
    local_258.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_258.field_2._M_local_buf[7] = 'e';
    local_258.field_2._M_local_buf[8] = 't';
    local_258._M_string_length = 9;
    local_258.field_2._M_local_buf[9] = '\0';
    local_298 = &local_288;
    local_278 = &local_268;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    local_1f8._0_8_ = pcVar1;
    local_1d8._M_p = pcVar2;
    local_b8._0_8_ = (pointer)(local_b8 + 0x10);
    this = (CdnAddCdnDomainRequestType *)aliyun::Cdn::CreateCdnClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               local_258.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,CONCAT17(uStack_281,local_288) + 1);
    }
    if (this != (CdnAddCdnDomainRequestType *)0x0) goto LAB_00108367;
    if (local_98 != local_90._M_local_buf + 8) {
      operator_delete(local_98,CONCAT71(local_90._9_7_,local_90._M_local_buf[8]) + 1);
    }
    if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,
                      CONCAT17(uStack_a1,CONCAT61(uStack_a7,local_b8[0x10])) + 1);
    }
    if (local_178._M_p != local_170 + 8) {
      operator_delete(local_178._M_p,CONCAT71(local_170._9_7_,local_170[8]) + 1);
    }
    if (local_198._M_p != local_190 + 8) {
      operator_delete(local_198._M_p,CONCAT71(local_190._9_7_,local_190[8]) + 1);
    }
    if (local_1b8._M_p != local_1b0 + 8) {
      operator_delete(local_1b8._M_p,CONCAT71(local_1b0._9_7_,local_1b0[8]) + 1);
    }
    if (local_1d8._M_p != pcVar2) {
      operator_delete(local_1d8._M_p,CONCAT71(local_1d0._9_7_,local_1d0[8]) + 1);
    }
    if ((pointer)local_1f8._0_8_ != pcVar1) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    local_1f8._8_8_ = (pointer)0x0;
    local_1f8._16_8_ = local_1f8._16_8_ & 0xffffffffffffff00;
    local_1d0._0_8_ = 0;
    local_1d0[8] = '\0';
    local_1b8._M_p = local_1b0 + 8;
    local_1b0._0_8_ = 0;
    local_1b0[8] = '\0';
    local_198._M_p = local_190 + 8;
    local_190._0_8_ = 0;
    local_190[8] = '\0';
    local_178._M_p = local_170 + 8;
    local_170._0_8_ = 0;
    local_170[8] = '\0';
    local_158._M_p = local_150 + 8;
    local_150._0_8_ = 0;
    local_150[8] = '\0';
    local_138._M_p = local_130 + 8;
    local_130._0_8_ = 0;
    local_130[8] = '\0';
    local_b8[0x10] = 0;
    uStack_a7 = 0;
    uStack_a1 = 0;
    local_b8._0_8_ = (pointer)0x0;
    local_b8._8_8_ = (pointer)0x0;
    local_288 = 0x676e61682d6e63;
    uStack_281 = 0x7a;
    uStack_280 = 0x68;
    uStack_27f = 0x756f;
    local_290 = 0xb;
    local_27d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = local_260 & 0xff00;
    local_258.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_258.field_2._M_local_buf[7] = 'e';
    local_258.field_2._M_local_buf[8] = 't';
    local_258._M_string_length = 9;
    local_258.field_2._M_local_buf[9] = '\0';
    local_298 = &local_288;
    local_278 = &local_268;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    local_1f8._0_8_ = pcVar1;
    local_1d8._M_p = pcVar2;
    this = (CdnAddCdnDomainRequestType *)aliyun::Cdn::CreateCdnClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               local_258.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,CONCAT17(uStack_281,local_288) + 1);
    }
    if (this != (CdnAddCdnDomainRequestType *)0x0) goto LAB_001084c8;
    std::
    vector<aliyun::CdnDescribeRefreshTasksCDNTaskType,_std::allocator<aliyun::CdnDescribeRefreshTasksCDNTaskType>_>
    ::~vector((vector<aliyun::CdnDescribeRefreshTasksCDNTaskType,_std::allocator<aliyun::CdnDescribeRefreshTasksCDNTaskType>_>
               *)local_b8);
    aliyun::CdnDescribeRefreshTasksRequestType::~CdnDescribeRefreshTasksRequestType
              ((CdnDescribeRefreshTasksRequestType *)local_1f8);
    local_1f8._8_8_ = (pointer)0x0;
    local_1f8._16_8_ = local_1f8._16_8_ & 0xffffffffffffff00;
    local_1d0._0_8_ = 0;
    local_1d0[8] = '\0';
    local_1b8._M_p = local_1b0 + 8;
    local_1b0._0_8_ = 0;
    local_1b0[8] = '\0';
    local_198._M_p = local_190 + 8;
    local_190._0_8_ = 0;
    local_190[8] = '\0';
    local_178._M_p = local_170 + 8;
    local_170._0_8_ = 0;
    local_170[8] = '\0';
    local_b8[0x10] = 0;
    uStack_a7 = 0;
    uStack_a1 = 0;
    local_b8._0_8_ = (pointer)0x0;
    local_b8._8_8_ = (pointer)0x0;
    local_288 = 0x676e61682d6e63;
    uStack_281 = 0x7a;
    uStack_280 = 0x68;
    uStack_27f = 0x756f;
    local_290 = 0xb;
    local_27d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = local_260 & 0xff00;
    local_258.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_258.field_2._M_local_buf[7] = 'e';
    local_258.field_2._M_local_buf[8] = 't';
    local_258._M_string_length = 9;
    local_258.field_2._M_local_buf[9] = '\0';
    local_298 = &local_288;
    local_278 = &local_268;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    local_1f8._0_8_ = pcVar1;
    local_1d8._M_p = pcVar2;
    this = (CdnAddCdnDomainRequestType *)aliyun::Cdn::CreateCdnClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               local_258.field_2._M_allocated_capacity._0_7_) + 1);
    }
    pCVar3 = (pointer)(local_b8 + 0x10);
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,CONCAT17(uStack_281,local_288) + 1);
    }
    if (this != (CdnAddCdnDomainRequestType *)0x0) goto LAB_00108651;
    std::
    vector<aliyun::CdnDescribeUserDomainsPageDataType,_std::allocator<aliyun::CdnDescribeUserDomainsPageDataType>_>
    ::~vector((vector<aliyun::CdnDescribeUserDomainsPageDataType,_std::allocator<aliyun::CdnDescribeUserDomainsPageDataType>_>
               *)local_b8);
    if (local_178._M_p != local_170 + 8) {
      operator_delete(local_178._M_p,CONCAT71(local_170._9_7_,local_170[8]) + 1);
    }
    if (local_198._M_p != local_190 + 8) {
      operator_delete(local_198._M_p,CONCAT71(local_190._9_7_,local_190[8]) + 1);
    }
    if (local_1b8._M_p != local_1b0 + 8) {
      operator_delete(local_1b8._M_p,CONCAT71(local_1b0._9_7_,local_1b0[8]) + 1);
    }
    if (local_1d8._M_p != pcVar2) {
      operator_delete(local_1d8._M_p,CONCAT71(local_1d0._9_7_,local_1d0[8]) + 1);
    }
    if ((pointer)local_1f8._0_8_ != pcVar1) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    local_1f8._8_8_ = (pointer)0x0;
    local_1f8._16_8_ = local_1f8._16_8_ & 0xffffffffffffff00;
    local_1d0._0_8_ = 0;
    local_1d0[8] = '\0';
    local_1b8._M_p = local_1b0 + 8;
    local_1b0._0_8_ = 0;
    local_1b0[8] = '\0';
    local_198._M_p = local_190 + 8;
    local_190._0_8_ = 0;
    local_190[8] = '\0';
    local_b8[0x10] = 99;
    uStack_a7 = 0x676e61682d6e;
    uStack_a1 = 0x7a;
    uStack_a0 = 0x756f68;
    local_b8._8_8_ = (pointer)0xb;
    uStack_9d = 0;
    local_288 = 0x697070615f796d;
    uStack_281 = 100;
    local_290 = 8;
    uStack_280 = 0;
    local_268 = 0x65726365735f796d;
    local_270 = 9;
    local_260 = 0x74;
    local_298 = &local_288;
    local_278 = &local_268;
    local_1f8._0_8_ = pcVar1;
    local_1d8._M_p = pcVar2;
    local_b8._0_8_ = pCVar3;
    this = (CdnAddCdnDomainRequestType *)aliyun::Cdn::CreateCdnClient();
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,CONCAT17(uStack_281,local_288) + 1);
    }
    if ((pointer)local_b8._0_8_ != pCVar3) {
      operator_delete((void *)local_b8._0_8_,
                      CONCAT17(uStack_a1,CONCAT61(uStack_a7,local_b8[0x10])) + 1);
    }
    if (this != (CdnAddCdnDomainRequestType *)0x0) goto LAB_001087b2;
    if (local_198._M_p != local_190 + 8) {
      operator_delete(local_198._M_p,CONCAT71(local_190._9_7_,local_190[8]) + 1);
    }
    if (local_1b8._M_p != local_1b0 + 8) {
      operator_delete(local_1b8._M_p,CONCAT71(local_1b0._9_7_,local_1b0[8]) + 1);
    }
    if (local_1d8._M_p != pcVar2) {
      operator_delete(local_1d8._M_p,CONCAT71(local_1d0._9_7_,local_1d0[8]) + 1);
    }
    if ((pointer)local_1f8._0_8_ != pcVar1) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    local_1f8._8_8_ = (pointer)0x0;
    local_1f8._16_8_ = local_1f8._16_8_ & 0xffffffffffffff00;
    local_1d0._0_8_ = 0;
    local_1d0[8] = '\0';
    local_1b8._M_p = local_1b0 + 8;
    local_1b0._0_8_ = 0;
    local_1b0[8] = '\0';
    local_198._M_p = local_190 + 8;
    local_190._0_8_ = 0;
    local_190[8] = '\0';
    local_b8[0x10] = 99;
    uStack_a7 = 0x676e61682d6e;
    uStack_a1 = 0x7a;
    uStack_a0 = 0x756f68;
    local_b8._8_8_ = (pointer)0xb;
    uStack_9d = 0;
    local_288 = 0x697070615f796d;
    uStack_281 = 100;
    local_290 = 8;
    uStack_280 = 0;
    local_268 = 0x65726365735f796d;
    local_270 = 9;
    local_260 = 0x74;
    local_298 = &local_288;
    local_278 = &local_268;
    local_1f8._0_8_ = pcVar1;
    local_1d8._M_p = pcVar2;
    local_b8._0_8_ = pCVar3;
    this = (CdnAddCdnDomainRequestType *)aliyun::Cdn::CreateCdnClient();
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,CONCAT17(uStack_281,local_288) + 1);
    }
    if ((pointer)local_b8._0_8_ != pCVar3) {
      operator_delete((void *)local_b8._0_8_,
                      CONCAT17(uStack_a1,CONCAT61(uStack_a7,local_b8[0x10])) + 1);
    }
    if (this != (CdnAddCdnDomainRequestType *)0x0) goto LAB_001088fa;
    if (local_198._M_p != local_190 + 8) {
      operator_delete(local_198._M_p,CONCAT71(local_190._9_7_,local_190[8]) + 1);
    }
    if (local_1b8._M_p != local_1b0 + 8) {
      operator_delete(local_1b8._M_p,CONCAT71(local_1b0._9_7_,local_1b0[8]) + 1);
    }
    if (local_1d8._M_p != pcVar2) {
      operator_delete(local_1d8._M_p,CONCAT71(local_1d0._9_7_,local_1d0[8]) + 1);
    }
    if ((pointer)local_1f8._0_8_ != pcVar1) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    local_1f8._8_8_ = (pointer)0x0;
    local_1f8._16_8_ = local_1f8._16_8_ & 0xffffffffffffff00;
    local_1d0._0_8_ = 0;
    local_1d0[8] = '\0';
    local_1b8._M_p = local_1b0 + 8;
    local_1b0._0_8_ = 0;
    local_1b0[8] = '\0';
    local_198._M_p = local_190 + 8;
    local_190._0_8_ = 0;
    local_190[8] = '\0';
    local_b8._8_8_ = (pointer)0x0;
    local_b8[0x10] = 0;
    local_288 = 0x676e61682d6e63;
    uStack_281 = 0x7a;
    uStack_280 = 0x68;
    uStack_27f = 0x756f;
    local_290 = 0xb;
    local_27d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = local_260 & 0xff00;
    local_258.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_258.field_2._M_local_buf[7] = 'e';
    local_258.field_2._M_local_buf[8] = 't';
    local_258._M_string_length = 9;
    local_258.field_2._M_local_buf[9] = '\0';
    local_298 = &local_288;
    local_278 = &local_268;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    local_1f8._0_8_ = pcVar1;
    local_1d8._M_p = pcVar2;
    local_b8._0_8_ = pCVar3;
    this = (CdnAddCdnDomainRequestType *)aliyun::Cdn::CreateCdnClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               local_258.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,CONCAT17(uStack_281,local_288) + 1);
    }
    if (this != (CdnAddCdnDomainRequestType *)0x0) goto LAB_00108a42;
    if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,
                      CONCAT17(uStack_a1,CONCAT61(uStack_a7,local_b8[0x10])) + 1);
    }
    if (local_198._M_p != local_190 + 8) {
      operator_delete(local_198._M_p,CONCAT71(local_190._9_7_,local_190[8]) + 1);
    }
    if (local_1b8._M_p != local_1b0 + 8) {
      operator_delete(local_1b8._M_p,CONCAT71(local_1b0._9_7_,local_1b0[8]) + 1);
    }
    if (local_1d8._M_p != pcVar2) {
      operator_delete(local_1d8._M_p,CONCAT71(local_1d0._9_7_,local_1d0[8]) + 1);
    }
    if ((pointer)local_1f8._0_8_ != pcVar1) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    local_1f8._8_8_ = (pointer)0x0;
    local_1f8._16_8_ = local_1f8._16_8_ & 0xffffffffffffff00;
    local_1d0._0_8_ = 0;
    local_1d0[8] = '\0';
    local_1b8._M_p = local_1b0 + 8;
    local_1b0._0_8_ = 0;
    local_1b0[8] = '\0';
    local_198._M_p = local_190 + 8;
    local_190._0_8_ = 0;
    local_190[8] = '\0';
    local_178._M_p = local_170 + 8;
    local_170._0_8_ = 0;
    local_170[8] = '\0';
    local_b8._8_8_ = (pointer)0x0;
    local_b8[0x10] = 0;
    local_288 = 0x676e61682d6e63;
    uStack_281 = 0x7a;
    uStack_280 = 0x68;
    uStack_27f = 0x756f;
    local_290 = 0xb;
    local_27d = 0;
    local_268 = 0x64697070615f796d;
    local_270 = 8;
    local_260 = local_260 & 0xff00;
    local_258.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_258.field_2._M_local_buf[7] = 'e';
    local_258.field_2._M_local_buf[8] = 't';
    local_258._M_string_length = 9;
    local_258.field_2._M_local_buf[9] = '\0';
    local_298 = &local_288;
    local_278 = &local_268;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    local_1f8._0_8_ = pcVar1;
    local_1d8._M_p = pcVar2;
    local_b8._0_8_ = (pointer)(local_b8 + 0x10);
    this = (CdnAddCdnDomainRequestType *)aliyun::Cdn::CreateCdnClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               local_258.field_2._M_allocated_capacity._0_7_) + 1);
    }
    pCVar3 = (pointer)(local_b8 + 0x10);
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,CONCAT17(uStack_281,local_288) + 1);
    }
    if (this != (CdnAddCdnDomainRequestType *)0x0) goto LAB_00108b8f;
    if ((pointer)local_b8._0_8_ != pCVar3) {
      operator_delete((void *)local_b8._0_8_,
                      CONCAT17(uStack_a1,CONCAT61(uStack_a7,local_b8[0x10])) + 1);
    }
    if (local_178._M_p != local_170 + 8) {
      operator_delete(local_178._M_p,CONCAT71(local_170._9_7_,local_170[8]) + 1);
    }
    if (local_198._M_p != local_190 + 8) {
      operator_delete(local_198._M_p,CONCAT71(local_190._9_7_,local_190[8]) + 1);
    }
    if (local_1b8._M_p != local_1b0 + 8) {
      operator_delete(local_1b8._M_p,CONCAT71(local_1b0._9_7_,local_1b0[8]) + 1);
    }
    if (local_1d8._M_p != pcVar2) {
      operator_delete(local_1d8._M_p,CONCAT71(local_1d0._9_7_,local_1d0[8]) + 1);
    }
    if ((pointer)local_1f8._0_8_ != pcVar1) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    local_1f8._8_8_ = (pointer)0x0;
    local_1f8._16_8_ = local_1f8._16_8_ & 0xffffffffffffff00;
    local_1d0._0_8_ = 0;
    local_1d0[8] = '\0';
    local_1b8._M_p = local_1b0 + 8;
    local_1b0._0_8_ = 0;
    local_1b0[8] = '\0';
    local_198._M_p = local_190 + 8;
    local_190._0_8_ = 0;
    local_190[8] = '\0';
    local_b8[0x10] = 99;
    uStack_a7 = 0x676e61682d6e;
    uStack_a1 = 0x7a;
    uStack_a0 = 0x756f68;
    local_b8._8_8_ = (pointer)0xb;
    uStack_9d = 0;
    local_288 = 0x697070615f796d;
    uStack_281 = 100;
    local_290 = 8;
    uStack_280 = 0;
    local_268 = 0x65726365735f796d;
    local_270 = 9;
    local_260 = 0x74;
    local_298 = &local_288;
    local_278 = &local_268;
    local_1f8._0_8_ = pcVar1;
    local_1d8._M_p = pcVar2;
    local_b8._0_8_ = pCVar3;
    this = (CdnAddCdnDomainRequestType *)aliyun::Cdn::CreateCdnClient();
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,CONCAT17(uStack_281,local_288) + 1);
    }
    if ((pointer)local_b8._0_8_ != pCVar3) {
      operator_delete((void *)local_b8._0_8_,
                      CONCAT17(uStack_a1,CONCAT61(uStack_a7,local_b8[0x10])) + 1);
    }
    if (this == (CdnAddCdnDomainRequestType *)0x0) {
      if (local_198._M_p != local_190 + 8) {
        operator_delete(local_198._M_p,CONCAT71(local_190._9_7_,local_190[8]) + 1);
      }
      if (local_1b8._M_p != local_1b0 + 8) {
        operator_delete(local_1b8._M_p,CONCAT71(local_1b0._9_7_,local_1b0[8]) + 1);
      }
      if (local_1d8._M_p != pcVar2) {
        operator_delete(local_1d8._M_p,CONCAT71(local_1d0._9_7_,local_1d0[8]) + 1);
      }
      if ((pointer)local_1f8._0_8_ != pcVar1) {
        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
      }
      local_1f8._8_8_ = (pointer)0x0;
      local_1f8._16_8_ = local_1f8._16_8_ & 0xffffffffffffff00;
      local_1d0._0_8_ = 0;
      local_1d0[8] = '\0';
      local_1b8._M_p = local_1b0 + 8;
      local_1b0._0_8_ = 0;
      local_1b0[8] = '\0';
      local_198._M_p = local_190 + 8;
      local_190._0_8_ = 0;
      local_190[8] = '\0';
      local_b8[0x10] = 99;
      uStack_a7 = 0x676e61682d6e;
      uStack_a1 = 0x7a;
      uStack_a0 = 0x756f68;
      local_b8._8_8_ = (pointer)0xb;
      uStack_9d = 0;
      local_288 = 0x697070615f796d;
      uStack_281 = 100;
      local_290 = 8;
      uStack_280 = 0;
      local_268 = 0x65726365735f796d;
      local_270 = 9;
      local_260 = 0x74;
      local_298 = &local_288;
      local_278 = &local_268;
      local_1f8._0_8_ = pcVar1;
      local_1d8._M_p = pcVar2;
      local_b8._0_8_ = pCVar3;
      this = (CdnAddCdnDomainRequestType *)aliyun::Cdn::CreateCdnClient();
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      if (local_298 != &local_288) {
        operator_delete(local_298,CONCAT17(uStack_281,local_288) + 1);
      }
      if ((pointer)local_b8._0_8_ != pCVar3) {
        operator_delete((void *)local_b8._0_8_,
                        CONCAT17(uStack_a1,CONCAT61(uStack_a7,local_b8[0x10])) + 1);
      }
      if (this == (CdnAddCdnDomainRequestType *)0x0) {
        if (local_198._M_p != local_190 + 8) {
          operator_delete(local_198._M_p,CONCAT71(local_190._9_7_,local_190[8]) + 1);
        }
        if (local_1b8._M_p != local_1b0 + 8) {
          operator_delete(local_1b8._M_p,CONCAT71(local_1b0._9_7_,local_1b0[8]) + 1);
        }
        if (local_1d8._M_p != pcVar2) {
          operator_delete(local_1d8._M_p,CONCAT71(local_1d0._9_7_,local_1d0[8]) + 1);
        }
        if ((pointer)local_1f8._0_8_ != pcVar1) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
        return 0;
      }
      goto LAB_00108e38;
    }
  }
  else {
    local_258.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_258.field_2._M_local_buf[7] = '.';
    local_258.field_2._M_local_buf[8] = '1';
    local_258.field_2._M_local_buf[9] = ':';
    local_258.field_2._10_5_ = 0x3433323231;
    local_258._M_string_length = 0xf;
    local_258.field_2._M_local_buf[0xf] = '\0';
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    aliyun::Cdn::SetProxyHost((Cdn *)this,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               local_258.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_218.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_218._M_string_length = 2;
    local_218.field_2._M_local_buf[2] = '\0';
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    HttpTestListener::SetResponseBody(pHVar8,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT17(local_218.field_2._M_local_buf[7],
                               CONCAT43(local_218.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_218.field_2._M_local_buf[2],
                                                 local_218.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_1f8,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_1d8,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_1b8,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_198,"DomainName");
    std::__cxx11::string::operator=((string *)&local_178,"SslFlag");
    std::__cxx11::string::operator=((string *)&local_158,"SourceType");
    std::__cxx11::string::operator=((string *)&local_138,"CdnType");
    std::__cxx11::string::operator=((string *)&local_118,"Sources");
    aliyun::Cdn::AddCdnDomain
              (this,(CdnAddCdnDomainResponseType *)local_1f8,(CdnErrorInfo *)&local_238);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_1();
LAB_00107b76:
    local_258.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_258.field_2._M_local_buf[7] = '.';
    local_258.field_2._M_local_buf[8] = '1';
    local_258.field_2._M_local_buf[9] = ':';
    local_258.field_2._10_5_ = 0x3433323231;
    local_258._M_string_length = 0xf;
    local_258.field_2._M_local_buf[0xf] = '\0';
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    aliyun::Cdn::SetProxyHost((Cdn *)this,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               local_258.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_218.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_218._M_string_length = 2;
    local_218.field_2._M_local_buf[2] = '\0';
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    HttpTestListener::SetResponseBody(pHVar8,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT17(local_218.field_2._M_local_buf[7],
                               CONCAT43(local_218.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_218.field_2._M_local_buf[2],
                                                 local_218.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_1f8,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_1d8,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_1b8,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_198,"DomainName");
    aliyun::Cdn::DeleteCdnDomain
              ((CdnDeleteCdnDomainRequestType *)this,(CdnDeleteCdnDomainResponseType *)local_1f8,
               (CdnErrorInfo *)&local_238);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_2();
LAB_00107cbe:
    local_218.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_218.field_2._M_local_buf[2] = '7';
    local_218.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_218.field_2._M_local_buf[7] = '.';
    local_218.field_2._8_7_ = 0x34333232313a31;
    local_218._M_string_length = 0xf;
    local_218.field_2._M_local_buf[0xf] = '\0';
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    aliyun::Cdn::SetProxyHost((Cdn *)this,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT17(local_218.field_2._M_local_buf[7],
                               CONCAT43(local_218.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_218.field_2._M_local_buf[2],
                                                 local_218.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"DomainBaseDetailModel\": {    \"Sources\": {      \"Source\": [        \"Source\"      ]    },    \"Cname\": \"Cname\",    \"CdnType\": \"CdnType\",    \"DomainStatus\": \"DomainStatus\",    \"SourceType\": \"SourceType\",    \"DomainName\": \"DomainName\",    \"Remark\": \"Remark\",    \"GmtModified\": \"GmtModified\",    \"GmtCreated\": \"GmtCreated\"  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar8,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_b8,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_98,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_78,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_58,"DomainName");
    aliyun::Cdn::DescribeCdnDomainBaseDetail
              ((CdnDescribeCdnDomainBaseDetailRequestType *)this,
               (CdnDescribeCdnDomainBaseDetailResponseType *)local_b8,(CdnErrorInfo *)local_1f8);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_3();
LAB_00107e0b:
    local_218.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_218.field_2._M_local_buf[2] = '7';
    local_218.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_218.field_2._M_local_buf[7] = '.';
    local_218.field_2._8_7_ = 0x34333232313a31;
    local_218._M_string_length = 0xf;
    local_218.field_2._M_local_buf[0xf] = '\0';
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    aliyun::Cdn::SetProxyHost((Cdn *)this,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT17(local_218.field_2._M_local_buf[7],
                               CONCAT43(local_218.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_218.field_2._M_local_buf[2],
                                                 local_218.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"GetDomainDetailModel\": {    \"Sources\": {      \"Source\": [        \"Source\"      ]    },    \"GmtCreated\": \"GmtCreated\",    \"GmtModified\": \"GmtModified\",    \"SourceType\": \"SourceType\",    \"DomainStatus\": \"DomainStatus\",    \"CdnType\": \"CdnType\",    \"Cname\": \"Cname\",    \"HttpsCname\": \"HttpsCname\",    \"DomainName\": \"DomainName\",    \"Remark\": \"Remark\"  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar8,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_b8,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_98,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_78,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_58,"DomainName");
    aliyun::Cdn::DescribeCdnDomainDetail
              ((CdnDescribeCdnDomainDetailRequestType *)this,
               (CdnDescribeCdnDomainDetailResponseType *)local_b8,(CdnErrorInfo *)local_1f8);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_4();
LAB_00107f58:
    local_218.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_218.field_2._M_local_buf[2] = '7';
    local_218.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_218.field_2._M_local_buf[7] = '.';
    local_218.field_2._8_7_ = 0x34333232313a31;
    local_218._M_string_length = 0xf;
    local_218.field_2._M_local_buf[0xf] = '\0';
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    aliyun::Cdn::SetProxyHost((Cdn *)this,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT17(local_218.field_2._M_local_buf[7],
                               CONCAT43(local_218.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_218.field_2._M_local_buf[2],
                                                 local_218.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"DomainLogModel\": {    \"DomainLogDetails\": {      \"DomainLogDetail\": [        {          \"LogName\": \"LogName\",          \"LogPath\": \"LogPath\",          \"LogSize\": 0,          \"StartTime\": \"StartTime\",          \"EndTime\": \"EndTime\"        }      ]    },    \"DomainName\": \"DomainName\"  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar8,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_1f8,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_1d8,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_1b8,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_198,"DomainName");
    std::__cxx11::string::operator=((string *)&local_178,"LogDay");
    aliyun::Cdn::DescribeCdnDomainLogs
              ((CdnDescribeCdnDomainLogsRequestType *)this,
               (CdnDescribeCdnDomainLogsResponseType *)local_1f8,(CdnErrorInfo *)local_b8);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_5();
LAB_001080b9:
    local_218.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_218.field_2._M_local_buf[2] = '7';
    local_218.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_218.field_2._M_local_buf[7] = '.';
    local_218.field_2._8_7_ = 0x34333232313a31;
    local_218._M_string_length = 0xf;
    local_218.field_2._M_local_buf[0xf] = '\0';
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    aliyun::Cdn::SetProxyHost((Cdn *)this,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT17(local_218.field_2._M_local_buf[7],
                               CONCAT43(local_218.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_218.field_2._M_local_buf[2],
                                                 local_218.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"MonitorDatas\": {    \"CDNMonitorData\": [      {        \"TimeStamp\": \"TimeStamp\",        \"QueryPerSecond\": \"QueryPerSecond\",        \"BytesPerSecond\": \"BytesPerSecond\",        \"BytesHitRate\": \"BytesHitRate\",        \"RequestHitRate\": \"RequestHitRate\",        \"AverageObjectSize\": \"AverageObjectSize\"      }    ]  },  \"DomainName\": \"DomainName\",  \"MonitorInterval\": 0,  \"StartTime\": \"StartTime\",  \"EndTime\": \"EndTime\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar8,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_1f8,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_1d8,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_1b8,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_198,"DomainName");
    std::__cxx11::string::operator=((string *)&local_178,"StartTime");
    std::__cxx11::string::operator=((string *)&local_158,"EndTime");
    aliyun::Cdn::DescribeCdnMonitorData
              ((CdnDescribeCdnMonitorDataRequestType *)this,
               (CdnDescribeCdnMonitorDataResponseType *)local_1f8,(CdnErrorInfo *)local_b8);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_6();
LAB_0010822e:
    local_218.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_218.field_2._M_local_buf[2] = '7';
    local_218.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_218.field_2._M_local_buf[7] = '.';
    local_218.field_2._8_7_ = 0x34333232313a31;
    local_218._M_string_length = 0xf;
    local_218.field_2._M_local_buf[0xf] = '\0';
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    aliyun::Cdn::SetProxyHost((Cdn *)this,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT17(local_218.field_2._M_local_buf[7],
                               CONCAT43(local_218.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_218.field_2._M_local_buf[2],
                                                 local_218.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"OperationLocks\": {    \"LockReason\": [      {        \"LockReason\": \"LockReason\"      }    ]  },  \"InternetChargeType\": \"InternetChargeType\",  \"OpeningTime\": \"OpeningTime\",  \"ChangingChargeType\": \"ChangingChargeType\",  \"ChangingAffectTime\": \"ChangingAffectTime\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar8,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_b8,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_98,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_78,"ResourceOwnerId");
    aliyun::Cdn::DescribeCdnService
              ((CdnDescribeCdnServiceRequestType *)this,
               (CdnDescribeCdnServiceResponseType *)local_b8,(CdnErrorInfo *)local_1f8);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_7();
LAB_00108367:
    local_218.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_218.field_2._M_local_buf[2] = '7';
    local_218.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_218.field_2._M_local_buf[7] = '.';
    local_218.field_2._8_7_ = 0x34333232313a31;
    local_218._M_string_length = 0xf;
    local_218.field_2._M_local_buf[0xf] = '\0';
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    aliyun::Cdn::SetProxyHost((Cdn *)this,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT17(local_218.field_2._M_local_buf[7],
                               CONCAT43(local_218.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_218.field_2._M_local_buf[2],
                                                 local_218.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,"{  \"Bps\": \"Bps\",  \"Qps\": \"Qps\"}","");
    HttpTestListener::SetResponseBody(pHVar8,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_1f8,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_1d8,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_1b8,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_198,"DomainName");
    std::__cxx11::string::operator=((string *)&local_178,"DataTime");
    aliyun::Cdn::DescribeOneMinuteData
              ((CdnDescribeOneMinuteDataRequestType *)this,
               (CdnDescribeOneMinuteDataResponseType *)local_1f8,(CdnErrorInfo *)local_b8);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_8();
LAB_001084c8:
    local_218.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_218.field_2._M_local_buf[2] = '7';
    local_218.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_218.field_2._M_local_buf[7] = '.';
    local_218.field_2._8_7_ = 0x34333232313a31;
    local_218._M_string_length = 0xf;
    local_218.field_2._M_local_buf[0xf] = '\0';
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    aliyun::Cdn::SetProxyHost((Cdn *)this,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT17(local_218.field_2._M_local_buf[7],
                               CONCAT43(local_218.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_218.field_2._M_local_buf[2],
                                                 local_218.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"Tasks\": {    \"CDNTask\": [      {        \"TaskId\": \"TaskId\",        \"ObjectPath\": \"ObjectPath\",        \"Status\": \"Status\",        \"CreationTime\": \"CreationTime\"      }    ]  },  \"PageNumber\": 0,  \"PageSize\": 0,  \"TotalCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar8,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_1f8,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_1d8,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_1b8,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_198,"TaskId");
    std::__cxx11::string::operator=((string *)&local_178,"ObjectPath");
    std::__cxx11::string::operator=((string *)&local_158,"PageNumber");
    std::__cxx11::string::operator=((string *)&local_138,"PageSize");
    aliyun::Cdn::DescribeRefreshTasks
              ((CdnDescribeRefreshTasksRequestType *)this,
               (CdnDescribeRefreshTasksResponseType *)local_1f8,(CdnErrorInfo *)local_b8);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_9();
LAB_00108651:
    local_218.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_218.field_2._M_local_buf[2] = '7';
    local_218.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_218.field_2._M_local_buf[7] = '.';
    local_218.field_2._8_7_ = 0x34333232313a31;
    local_218._M_string_length = 0xf;
    local_218.field_2._M_local_buf[0xf] = '\0';
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    aliyun::Cdn::SetProxyHost((Cdn *)this,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT17(local_218.field_2._M_local_buf[7],
                               CONCAT43(local_218.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_218.field_2._M_local_buf[2],
                                                 local_218.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"Domains\": {    \"PageData\": [      {        \"DomainName\": \"DomainName\",        \"Cname\": \"Cname\",        \"CdnType\": \"CdnType\",        \"DomainStatus\": \"DomainStatus\",        \"GmtCreated\": \"GmtCreated\",        \"GmtModified\": \"GmtModified\"      }    ]  },  \"PageNumber\": 0,  \"PageSize\": 0,  \"TotalCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar8,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_1f8,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_1d8,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_1b8,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_198,"PageSize");
    std::__cxx11::string::operator=((string *)&local_178,"PageNumber");
    aliyun::Cdn::DescribeUserDomains
              ((CdnDescribeUserDomainsRequestType *)this,
               (CdnDescribeUserDomainsResponseType *)local_1f8,(CdnErrorInfo *)local_b8);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_10();
LAB_001087b2:
    local_258.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_258.field_2._M_local_buf[7] = '.';
    local_258.field_2._M_local_buf[8] = '1';
    local_258.field_2._M_local_buf[9] = ':';
    local_258.field_2._10_5_ = 0x3433323231;
    local_258._M_string_length = 0xf;
    local_258.field_2._M_local_buf[0xf] = '\0';
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    aliyun::Cdn::SetProxyHost((Cdn *)this,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               local_258.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_218.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_218._M_string_length = 2;
    local_218.field_2._M_local_buf[2] = '\0';
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    HttpTestListener::SetResponseBody(pHVar8,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT17(local_218.field_2._M_local_buf[7],
                               CONCAT43(local_218.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_218.field_2._M_local_buf[2],
                                                 local_218.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_1f8,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_1d8,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_1b8,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_198,"InternetChargeType");
    aliyun::Cdn::ModifyCdnService
              ((CdnModifyCdnServiceRequestType *)this,(CdnModifyCdnServiceResponseType *)local_1f8,
               (CdnErrorInfo *)&local_238);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_11();
LAB_001088fa:
    local_258.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_258.field_2._M_local_buf[7] = '.';
    local_258.field_2._M_local_buf[8] = '1';
    local_258.field_2._M_local_buf[9] = ':';
    local_258.field_2._10_5_ = 0x3433323231;
    local_258._M_string_length = 0xf;
    local_258.field_2._M_local_buf[0xf] = '\0';
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    aliyun::Cdn::SetProxyHost((Cdn *)this,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               local_258.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_218.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_218._M_string_length = 2;
    local_218.field_2._M_local_buf[2] = '\0';
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    HttpTestListener::SetResponseBody(pHVar8,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT17(local_218.field_2._M_local_buf[7],
                               CONCAT43(local_218.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_218.field_2._M_local_buf[2],
                                                 local_218.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_1f8,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_1d8,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_1b8,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_198,"InternetChargeType");
    aliyun::Cdn::OpenCdnService
              ((CdnOpenCdnServiceRequestType *)this,(CdnOpenCdnServiceResponseType *)local_1f8,
               (CdnErrorInfo *)&local_238);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_12();
LAB_00108a42:
    local_218.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_218.field_2._M_local_buf[2] = '7';
    local_218.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_218.field_2._M_local_buf[7] = '.';
    local_218.field_2._8_7_ = 0x34333232313a31;
    local_218._M_string_length = 0xf;
    local_218.field_2._M_local_buf[0xf] = '\0';
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    aliyun::Cdn::SetProxyHost((Cdn *)this,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT17(local_218.field_2._M_local_buf[7],
                               CONCAT43(local_218.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_218.field_2._M_local_buf[2],
                                                 local_218.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,"{  \"PushTaskId\": \"PushTaskId\"}","");
    HttpTestListener::SetResponseBody(pHVar8,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_1f8,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_1d8,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_1b8,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_198,"ObjectPath");
    aliyun::Cdn::PushObjectCache
              ((CdnPushObjectCacheRequestType *)this,(CdnPushObjectCacheResponseType *)local_1f8,
               (CdnErrorInfo *)local_b8);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_13();
LAB_00108b8f:
    local_218.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_218.field_2._M_local_buf[2] = '7';
    local_218.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_218.field_2._M_local_buf[7] = '.';
    local_218.field_2._8_7_ = 0x34333232313a31;
    local_218._M_string_length = 0xf;
    local_218.field_2._M_local_buf[0xf] = '\0';
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    aliyun::Cdn::SetProxyHost((Cdn *)this,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT17(local_218.field_2._M_local_buf[7],
                               CONCAT43(local_218.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_218.field_2._M_local_buf[2],
                                                 local_218.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,"{  \"RefreshTaskId\": \"RefreshTaskId\"}","");
    HttpTestListener::SetResponseBody(pHVar8,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_1f8,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_1d8,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_1b8,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_198,"ObjectPath");
    std::__cxx11::string::operator=((string *)&local_178,"ObjectType");
    aliyun::Cdn::RefreshObjectCaches
              ((CdnRefreshObjectCachesRequestType *)this,
               (CdnRefreshObjectCachesResponseType *)local_1f8,(CdnErrorInfo *)local_b8);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_14();
  }
  local_258.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
  local_258.field_2._M_local_buf[7] = '.';
  local_258.field_2._M_local_buf[8] = '1';
  local_258.field_2._M_local_buf[9] = ':';
  local_258.field_2._10_5_ = 0x3433323231;
  local_258._M_string_length = 0xf;
  local_258.field_2._M_local_buf[0xf] = '\0';
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  aliyun::Cdn::SetProxyHost((Cdn *)this,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,
                    CONCAT17(local_258.field_2._M_local_buf[7],
                             local_258.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
    *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
  }
  pHVar8 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar8,0x2fca);
  local_218.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_218._M_string_length = 2;
  local_218.field_2._M_local_buf[2] = '\0';
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  HttpTestListener::SetResponseBody(pHVar8,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,
                    CONCAT17(local_218.field_2._M_local_buf[7],
                             CONCAT43(local_218.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_218.field_2._M_local_buf[2],
                                               local_218.field_2._M_allocated_capacity._0_2_))) + 1)
    ;
  }
  HttpTestListener::Start(pHVar8);
  std::__cxx11::string::operator=((string *)local_1f8,"OwnerId");
  std::__cxx11::string::operator=((string *)&local_1d8,"ResourceOwnerAccount");
  std::__cxx11::string::operator=((string *)&local_1b8,"ResourceOwnerId");
  std::__cxx11::string::operator=((string *)&local_198,"DomainName");
  aliyun::Cdn::StartCdnDomain
            ((CdnStartCdnDomainRequestType *)this,(CdnStartCdnDomainResponseType *)local_1f8,
             (CdnErrorInfo *)&local_238);
  HttpTestListener::WaitComplete(pHVar8);
  main_cold_15();
LAB_00108e38:
  local_258.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
  local_258.field_2._M_local_buf[7] = '.';
  local_258.field_2._M_local_buf[8] = '1';
  local_258.field_2._M_local_buf[9] = ':';
  local_258.field_2._10_5_ = 0x3433323231;
  local_258._M_string_length = 0xf;
  local_258.field_2._M_local_buf[0xf] = '\0';
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  aliyun::Cdn::SetProxyHost((Cdn *)this,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,
                    CONCAT17(local_258.field_2._M_local_buf[7],
                             local_258.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
    *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
  }
  pHVar8 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar8,0x2fca);
  local_218.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_218._M_string_length = 2;
  local_218.field_2._M_local_buf[2] = '\0';
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  HttpTestListener::SetResponseBody(pHVar8,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,
                    CONCAT17(local_218.field_2._M_local_buf[7],
                             CONCAT43(local_218.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_218.field_2._M_local_buf[2],
                                               local_218.field_2._M_allocated_capacity._0_2_))) + 1)
    ;
  }
  HttpTestListener::Start(pHVar8);
  std::__cxx11::string::operator=((string *)local_1f8,"OwnerId");
  std::__cxx11::string::operator=((string *)&local_1d8,"ResourceOwnerAccount");
  std::__cxx11::string::operator=((string *)&local_1b8,"ResourceOwnerId");
  std::__cxx11::string::operator=((string *)&local_198,"DomainName");
  aliyun::Cdn::StopCdnDomain
            ((CdnStopCdnDomainRequestType *)this,(CdnStopCdnDomainResponseType *)local_1f8,
             (CdnErrorInfo *)&local_238);
  HttpTestListener::WaitComplete(pHVar8);
  main_cold_16();
  std::
  vector<aliyun::CdnDescribeRefreshTasksCDNTaskType,_std::allocator<aliyun::CdnDescribeRefreshTasksCDNTaskType>_>
  ::~vector((vector<aliyun::CdnDescribeRefreshTasksCDNTaskType,_std::allocator<aliyun::CdnDescribeRefreshTasksCDNTaskType>_>
             *)local_b8);
  aliyun::CdnDescribeRefreshTasksRequestType::~CdnDescribeRefreshTasksRequestType
            ((CdnDescribeRefreshTasksRequestType *)local_1f8);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main() {
  test_add_cdn_domain();
  test_delete_cdn_domain();
  test_describe_cdn_domain_base_detail();
  test_describe_cdn_domain_detail();
  test_describe_cdn_domain_logs();
  test_describe_cdn_monitor_data();
  test_describe_cdn_service();
  test_describe_one_minute_data();
  test_describe_refresh_tasks();
  test_describe_user_domains();
  test_modify_cdn_service();
  test_open_cdn_service();
  test_push_object_cache();
  test_refresh_object_caches();
  test_start_cdn_domain();
  test_stop_cdn_domain();
}